

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O3

void __thiscall QPDFArgParser::parseArgs(QPDFArgParser *this)

{
  option_table_t *poVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
  *p_Var2;
  size_type sVar3;
  bool bVar4;
  element_type *peVar5;
  long lVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  logic_error *this_00;
  long *extraout_RAX;
  long *extraout_RAX_00;
  long *plVar9;
  _Rb_tree_node_base *p_Var10;
  undefined8 extraout_RAX_01;
  uint uVar11;
  char *pcVar12;
  size_type *psVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  undefined1 uVar15;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R12;
  iterator unaff_R14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R15;
  _Base_ptr p_Var16;
  string message;
  string arg_s;
  string parameter;
  string o_arg;
  key_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  long local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  key_type local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  key_type local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined2 *local_50;
  undefined8 local_48;
  undefined2 local_40;
  undefined1 local_3e;
  
  peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar5->option_table = &peVar5->main_option_table;
  pcVar12 = "main";
  std::__cxx11::string::_M_replace
            ((ulong)&peVar5->option_table_name,0,
             (char *)(peVar5->option_table_name)._M_string_length,0x2638d8);
  checkCompletion(this);
  handleArgFileArguments(this);
  peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar5->cur_arg = 1;
  if (1 < peVar5->argc) {
    pcVar12 = (char *)0x1;
    do {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      poVar1 = peVar5->option_table;
      pcVar12 = peVar5->argv[(int)pcVar12];
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,pcVar12,(allocator<char> *)&local_f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,pcVar12,(allocator<char> *)&local_130);
      sVar3 = local_f0._M_string_length;
      if (*pcVar12 == '-') {
        if ((pcVar12[1] == '-') && (pcVar12[2] == '\0')) {
          p_Var2 = &((this->m).
                     super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->option_table->_M_t;
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"--","");
          unaff_R14 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                      ::find(p_Var2,&local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((_Rb_tree_header *)unaff_R14._M_node ==
              &(((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->option_table->_M_t)._M_impl.super__Rb_tree_header) {
            this_00 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(this_00,"QPDFArgParser: -- handler not registered");
            __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          bVar4 = true;
          goto LAB_00160871;
        }
        if (pcVar12[1] == '\0') goto LAB_001607f6;
        __s = pcVar12 + 1;
        if (pcVar12[1] == '-') {
          __s = pcVar12 + 2;
        }
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)&local_f0,0,(char *)sVar3,(ulong)__s);
        if ((char *)local_f0._M_string_length == (char *)0x0) {
LAB_00160878:
          uVar15 = _S_red;
        }
        else {
          lVar6 = std::__cxx11::string::find((char)&local_f0,0x3d);
          if (lVar6 == -1) goto LAB_00160878;
          std::__cxx11::string::substr((ulong)&local_130,(ulong)&local_f0);
          std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::substr((ulong)&local_130,(ulong)&local_f0);
          std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          uVar15 = _S_black;
        }
        peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (((peVar5->bash_completion != false) || (peVar5->argc != 2)) || (peVar5->cur_arg != 1)) {
LAB_001608ce:
          unaff_R14._M_node = &(poVar1->_M_t)._M_impl.super__Rb_tree_header._M_header;
          if (((char *)local_f0._M_string_length != (char *)0x0) &&
             (*local_f0._M_dataplus._M_p != '-')) {
            unaff_R14 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                        ::find(&((this->m).
                                 super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->option_table->_M_t,&local_f0);
          }
          bVar4 = false;
          goto LAB_001608fe;
        }
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                ::find(&(peVar5->help_option_table)._M_t,&local_f0);
        p_Var16 = &(peVar5->help_option_table)._M_t._M_impl.super__Rb_tree_header._M_header;
        if (cVar7._M_node == p_Var16) goto LAB_001608ce;
        unaff_R14 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                    ::find(&(((this->m).
                              super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->help_option_table)._M_t,&local_f0);
        unaff_R15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71((int7)((ulong)p_Var16 >> 8),1);
        bVar4 = false;
      }
      else {
LAB_001607f6:
        p_Var2 = &((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->option_table->_M_t;
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
        unaff_R14 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
                    ::find(p_Var2,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        sVar3 = local_b0._M_string_length;
        strlen(pcVar12);
        bVar4 = false;
        std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)sVar3,(ulong)pcVar12);
LAB_00160871:
        uVar15 = _S_red;
LAB_001608fe:
        unaff_R15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
      }
      if ((_Rb_tree_header *)unaff_R14._M_node ==
          &(((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->option_table->_M_t)._M_impl.super__Rb_tree_header) {
        std::operator+(&local_130,"unrecognized argument ",&local_70);
        peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (peVar5->option_table != &peVar5->main_option_table) {
          std::operator+(&local_d0," (",&peVar5->option_table_name);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_d0);
          local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar9;
          psVar13 = (size_type *)(plVar9 + 2);
          if (local_110 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_100._M_allocated_capacity = *psVar13;
            local_100._8_8_ = plVar9[3];
            local_110 = &local_100;
          }
          else {
            local_100._M_allocated_capacity = *psVar13;
          }
          local_108 = plVar9[1];
          *plVar9 = (long)psVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_110);
          if (local_110 != &local_100) {
            operator_delete(local_110,local_100._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        usage(this,&local_130);
LAB_00160b84:
        exit(0);
      }
      if (((undefined1)((char)unaff_R14._M_node[2]._M_color ^ _S_black | uVar15) != _S_black) ||
         ((uVar15 == _S_black && unaff_R14._M_node[4]._M_left != (_Base_ptr)0x0 &&
          (cVar8 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&unaff_R14._M_node[3]._M_parent,&local_b0),
          cVar8._M_node == (_Base_ptr)&unaff_R14._M_node[3]._M_left)))) {
        std::operator+(&local_90,"--",&local_f0);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_90);
        unaff_R15 = &local_d0.field_2;
        local_d0._M_dataplus._M_p = (pointer)*plVar9;
        psVar13 = (size_type *)(plVar9 + 2);
        if ((size_type *)local_d0._M_dataplus._M_p == psVar13) {
          local_d0.field_2._M_allocated_capacity = *psVar13;
          local_d0.field_2._8_8_ = plVar9[3];
          local_d0._M_dataplus._M_p = (pointer)unaff_R15;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar13;
        }
        local_d0._M_string_length = plVar9[1];
        *plVar9 = (long)psVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_d0,(ulong)local_f0._M_dataplus._M_p);
        unaff_R12 = &local_100;
        local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar9;
        psVar13 = (size_type *)(plVar9 + 2);
        if (local_110 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_100._M_allocated_capacity = *psVar13;
          local_100._8_8_ = plVar9[3];
          local_110 = unaff_R12;
        }
        else {
          local_100._M_allocated_capacity = *psVar13;
        }
        local_108 = plVar9[1];
        *plVar9 = (long)psVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_110);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9;
        pcVar12 = (char *)(plVar9 + 2);
        if (paVar14 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar12) goto LAB_00160e06;
        local_130.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
        local_130.field_2._8_8_ = plVar9[3];
        goto LAB_00160e13;
      }
      if (unaff_R14._M_node[5]._M_parent == (_Base_ptr)0x0) {
        if (unaff_R14._M_node[6]._M_parent != (_Base_ptr)0x0) {
          (*(code *)unaff_R14._M_node[6]._M_left)();
        }
      }
      else {
        if (uVar15 != _S_red) {
          local_50 = &local_40;
          local_40 = 0x2d2d;
          local_48 = 2;
          local_3e = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_50,(ulong)local_f0._M_dataplus._M_p);
          local_90._M_dataplus._M_p = (pointer)*plVar9;
          psVar13 = (size_type *)(plVar9 + 2);
          if ((size_type *)local_90._M_dataplus._M_p == psVar13) {
            local_90.field_2._M_allocated_capacity = *psVar13;
            local_90.field_2._8_8_ = plVar9[3];
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          }
          else {
            local_90.field_2._M_allocated_capacity = *psVar13;
          }
          local_90._M_string_length = plVar9[1];
          *plVar9 = (long)psVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_90);
          local_d0._M_dataplus._M_p = (pointer)*plVar9;
          psVar13 = (size_type *)(plVar9 + 2);
          if ((size_type *)local_d0._M_dataplus._M_p == psVar13) {
            local_d0.field_2._M_allocated_capacity = *psVar13;
            local_d0.field_2._8_8_ = plVar9[3];
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar13;
          }
          local_d0._M_string_length = plVar9[1];
          *plVar9 = (long)psVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_d0,(ulong)local_b0._M_dataplus._M_p);
          local_110 = &local_100;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar9;
          pcVar12 = (char *)(plVar9 + 2);
          if (paVar14 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar12) goto LAB_00160edf;
          local_100._M_allocated_capacity = *(undefined8 *)pcVar12;
          local_100._8_8_ = plVar9[3];
          goto LAB_00160eec;
        }
        (*(code *)unaff_R14._M_node[5]._M_left)();
      }
      if ((char)unaff_R15 != '\0') goto LAB_00160b84;
      if (bVar4) {
        peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        peVar5->option_table = &peVar5->main_option_table;
        std::__cxx11::string::_M_replace
                  ((ulong)&peVar5->option_table_name,0,
                   (char *)(peVar5->option_table_name)._M_string_length,0x2638d8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      unaff_R12 = &local_b0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != unaff_R12) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
      peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      uVar11 = peVar5->cur_arg + 1;
      pcVar12 = (char *)(ulong)uVar11;
      peVar5->cur_arg = uVar11;
    } while ((int)uVar11 < peVar5->argc);
  }
  if (peVar5->bash_completion != true) {
    doFinalChecks(this);
    return;
  }
  handleCompletion(this);
  plVar9 = extraout_RAX;
  paVar14 = extraout_RDX;
LAB_00160e06:
  local_130.field_2._M_allocated_capacity = *(undefined8 *)pcVar12;
  local_130._M_dataplus._M_p = (pointer)paVar14;
LAB_00160e13:
  local_130._M_string_length = plVar9[1];
  *plVar9 = (long)pcVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if (local_110 != unaff_R12) {
    operator_delete(local_110,local_100._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != unaff_R15) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (unaff_R14._M_node[7]._M_parent == (_Base_ptr)0x0) {
    if (unaff_R14._M_node[4]._M_left != (_Base_ptr)0x0) {
      std::__cxx11::string::append((char *)&local_130);
      p_Var10 = *(_Rb_tree_node_base **)(unaff_R14._M_node + 4);
      if (p_Var10 != (_Rb_tree_node_base *)&unaff_R14._M_node[3]._M_left) {
        bVar4 = true;
        do {
          if (!bVar4) {
            std::__cxx11::string::append((char *)&local_130);
          }
          std::__cxx11::string::_M_append((char *)&local_130,*(ulong *)(p_Var10 + 1));
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
          bVar4 = false;
        } while (p_Var10 != (_Rb_tree_node_base *)&unaff_R14._M_node[3]._M_left);
      }
      std::__cxx11::string::append((char *)&local_130);
      goto LAB_00160ed2;
    }
    if (unaff_R14._M_node[2]._M_left != (_Base_ptr)0x0) {
      std::__cxx11::string::_M_append((char *)&local_130,(ulong)unaff_R14._M_node[2]._M_parent);
      goto LAB_00160ed2;
    }
  }
  else {
    (*(code *)unaff_R14._M_node[7]._M_left)(&unaff_R14._M_node[6]._M_right,&local_b0);
  }
  std::__cxx11::string::append((char *)&local_130);
LAB_00160ed2:
  usage(this,&local_130);
  plVar9 = extraout_RAX_00;
  paVar14 = extraout_RDX_00;
LAB_00160edf:
  local_100._M_allocated_capacity = *(undefined8 *)pcVar12;
  local_110 = paVar14;
LAB_00160eec:
  local_108 = plVar9[1];
  *plVar9 = (long)pcVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_130._M_dataplus._M_p = (pointer)*plVar9;
  psVar13 = (size_type *)(plVar9 + 2);
  if ((size_type *)local_130._M_dataplus._M_p == psVar13) {
    local_130.field_2._M_allocated_capacity = *psVar13;
    local_130.field_2._8_8_ = plVar9[3];
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar13;
  }
  local_130._M_string_length = plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  usage(this,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  _Unwind_Resume(extraout_RAX_01);
}

Assistant:

void
QPDFArgParser::parseArgs()
{
    selectMainOptionTable();
    checkCompletion();
    handleArgFileArguments();
    for (m->cur_arg = 1; m->cur_arg < m->argc; ++m->cur_arg) {
        bool help_option = false;
        bool end_option = false;
        auto oep = m->option_table->end();
        char const* arg = m->argv[m->cur_arg];
        std::string parameter;
        bool have_parameter = false;
        std::string o_arg(arg);
        std::string arg_s(arg);
        if (strcmp(arg, "--") == 0) {
            // Special case for -- option, which is used to break out of subparsers.
            oep = m->option_table->find("--");
            end_option = true;
            if (oep == m->option_table->end()) {
                // This is registered automatically, so this can't happen.
                throw std::logic_error("QPDFArgParser: -- handler not registered");
            }
        } else if ((arg[0] == '-') && (strcmp(arg, "-") != 0)) {
            ++arg;
            if (arg[0] == '-') {
                // Be lax about -arg vs --arg
                ++arg;
            } else {
                QTC::TC("libtests", "QPDFArgParser single dash");
            }

            // Prevent --=something from being treated as an empty arg by searching for = from after
            // the first character. We do this since the empty string in the option table is for
            // positional arguments. Besides, it doesn't make sense to have an empty option.
            arg_s = arg;
            size_t equal_pos = std::string::npos;
            if (arg_s.length() > 0) {
                equal_pos = arg_s.find('=', 1);
            }
            if (equal_pos != std::string::npos) {
                have_parameter = true;
                parameter = arg_s.substr(equal_pos + 1);
                arg_s = arg_s.substr(0, equal_pos);
            }

            if ((!m->bash_completion) && (m->argc == 2) && (m->cur_arg == 1) &&
                m->help_option_table.count(arg_s)) {
                // Handle help option, which is only valid as the sole option.
                QTC::TC("libtests", "QPDFArgParser help option");
                oep = m->help_option_table.find(arg_s);
                help_option = true;
            }

            if (!(help_option || arg_s.empty() || (arg_s.at(0) == '-'))) {
                oep = m->option_table->find(arg_s);
            }
        } else {
            // The empty string maps to the positional argument handler.
            QTC::TC("libtests", "QPDFArgParser positional");
            oep = m->option_table->find("");
            parameter = arg;
        }

        if (oep == m->option_table->end()) {
            QTC::TC("libtests", "QPDFArgParser unrecognized");
            std::string message = "unrecognized argument " + o_arg;
            if (m->option_table != &m->main_option_table) {
                message += " (" + m->option_table_name + " options must be terminated with --)";
            }
            usage(message);
        }

        OptionEntry& oe = oep->second;
        if ((oe.parameter_needed && (!have_parameter)) ||
            ((!oe.choices.empty() && have_parameter && (0 == oe.choices.count(parameter))))) {
            std::string message = "--" + arg_s + " must be given as --" + arg_s + "=";
            if (oe.invalid_choice_handler) {
                oe.invalid_choice_handler(parameter);
                // Method should call usage() or exit. Just in case it doesn't...
                message += "option";
            } else if (!oe.choices.empty()) {
                QTC::TC("libtests", "QPDFArgParser required choices");
                message += "{";
                bool first = true;
                for (auto const& choice: oe.choices) {
                    if (first) {
                        first = false;
                    } else {
                        message += ",";
                    }
                    message += choice;
                }
                message += "}";
            } else if (!oe.parameter_name.empty()) {
                QTC::TC("libtests", "QPDFArgParser required parameter");
                message += oe.parameter_name;
            } else {
                // should not be possible
                message += "option";
            }
            usage(message);
        }

        if (oe.bare_arg_handler) {
            if (have_parameter) {
                usage(
                    "--"s + arg_s + " does not take a parameter, but \"" + parameter +
                    "\" was given");
            }
            oe.bare_arg_handler();
        } else if (oe.param_arg_handler) {
            oe.param_arg_handler(parameter);
        }
        if (help_option) {
            exit(0);
        }
        if (end_option) {
            selectMainOptionTable();
        }
    }
    if (m->bash_completion) {
        handleCompletion();
    } else {
        doFinalChecks();
    }
}